

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_curves.cpp
# Opt level: O2

PrimInfo * __thiscall
embree::avx::
CurveGeometryISA<(embree::Geometry::GType)1,_embree::avx::HermiteCurveGeometryInterface,_embree::HermiteCurveT>
::createPrimRefArrayMB
          (PrimInfo *__return_storage_ptr__,
          CurveGeometryISA<(embree::Geometry::GType)1,_embree::avx::HermiteCurveGeometryInterface,_embree::HermiteCurveT>
          *this,PrimRef *prims,BBox1f *time_range,range<unsigned_long> *r,size_t k,uint geomID)

{
  float fVar1;
  BBox1f BVar2;
  uint uVar3;
  BufferView<embree::Vec3fx> *pBVar4;
  BufferView<embree::Vec3fx> *pBVar5;
  long lVar6;
  long lVar7;
  undefined1 auVar8 [16];
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar9;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar10;
  float fVar11;
  int iVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined4 uVar15;
  int iVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  long lVar20;
  int iVar21;
  size_t itime;
  float fVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  float fVar29;
  float fVar30;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [64];
  undefined1 auVar34 [64];
  float fVar35;
  undefined1 auVar36 [16];
  undefined1 auVar37 [64];
  undefined1 auVar38 [16];
  undefined1 auVar39 [64];
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  float local_1c8;
  float fStack_1c4;
  float fStack_1c0;
  float fStack_1bc;
  size_t local_1b8;
  size_t local_1b0;
  anon_class_16_2_07cfa4d6 local_198;
  undefined1 local_188 [16];
  undefined1 local_178 [16];
  float local_168;
  float fStack_164;
  float fStack_160;
  float fStack_15c;
  float local_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  undefined1 local_148 [8];
  float fStack_140;
  float fStack_13c;
  PrimRef *local_138;
  PrimInfo *local_130;
  range<unsigned_long> *local_128;
  ulong local_120;
  BBox<embree::Vec3fa> bupper1;
  BBox<embree::Vec3fa> blower0;
  BBox<embree::Vec3fa> bi;
  BBox<embree::Vec3fa> bupper0;
  BBox<embree::Vec3fa> blower1;
  
  local_188._8_4_ = 0x7f800000;
  local_188._0_8_ = 0x7f8000007f800000;
  local_188._12_4_ = 0x7f800000;
  auVar33 = ZEXT1664(local_188);
  *(undefined1 (*) [16])
   (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0.
   m128 = local_188;
  local_178._8_4_ = 0xff800000;
  local_178._0_8_ = 0xff800000ff800000;
  local_178._12_4_ = 0xff800000;
  auVar34 = ZEXT1664(local_178);
  *(undefined1 (*) [16])
   (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.field_0.
   m128 = local_178;
  *(undefined1 (*) [16])
   (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.field_0.
   m128 = local_188;
  *(undefined1 (*) [16])
   (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.field_0.
   m128 = local_178;
  __return_storage_ptr__->begin = 0;
  __return_storage_ptr__->end = 0;
  auVar23._8_8_ = 0;
  auVar23._0_4_ =
       (this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).super_CurveGeometry.
       super_Geometry.time_range.lower;
  auVar23._4_4_ =
       (this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).super_CurveGeometry.
       super_Geometry.time_range.upper;
  auVar25._8_8_ = 0;
  auVar25._0_4_ = time_range->lower;
  auVar25._4_4_ = time_range->upper;
  auVar8 = vcmpps_avx(auVar23,auVar25,1);
  auVar32 = vinsertps_avx(auVar25,auVar23,0x50);
  auVar23 = vinsertps_avx(auVar23,auVar25,0x50);
  auVar8 = vblendvps_avx(auVar23,auVar32,auVar8);
  auVar32 = vmovshdup_avx(auVar8);
  fVar35 = auVar32._0_4_;
  if (auVar8._0_4_ <= fVar35) {
    uVar18 = r->_begin;
    local_1b0 = 0;
    auVar37 = ZEXT1664(CONCAT412(0xddccb9a2,CONCAT48(0xddccb9a2,0xddccb9a2ddccb9a2)));
    auVar39 = ZEXT1664(CONCAT412(0x5dccb9a2,CONCAT48(0x5dccb9a2,0x5dccb9a25dccb9a2)));
    local_1b8 = k;
    local_138 = prims;
    local_130 = __return_storage_ptr__;
    local_128 = r;
    while( true ) {
      auVar23 = auVar34._0_16_;
      auVar32 = auVar33._0_16_;
      if (r->_end <= uVar18) break;
      BVar2 = (this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).super_CurveGeometry
              .super_Geometry.time_range;
      auVar24._8_8_ = 0;
      auVar24._0_4_ = BVar2.lower;
      auVar24._4_4_ = BVar2.upper;
      auVar25 = vmovshdup_avx(auVar24);
      fVar22 = BVar2.lower;
      fVar11 = auVar25._0_4_ - fVar22;
      uVar3 = *(uint *)(*(long *)&(this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>)
                                  .super_CurveGeometry.super_Geometry.field_0x58 +
                       *(long *)&(this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).
                                 super_CurveGeometry.field_0x68 * uVar18);
      uVar17 = (ulong)(uVar3 + 1);
      pBVar4 = (this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).
               super_CurveGeometry.vertices.items;
      if (uVar17 < (pBVar4->super_RawBufferView).num) {
        fVar1 = (this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).
                super_CurveGeometry.super_Geometry.fnumTimeSegments;
        auVar24 = ZEXT416((uint)(fVar1 * ((fVar35 - fVar22) / fVar11) * 0.99999976));
        auVar24 = vroundss_avx(auVar24,auVar24,10);
        auVar27 = vminss_avx(auVar24,ZEXT416((uint)fVar1));
        fVar29 = auVar8._0_4_ - fVar22;
        auVar24 = ZEXT416((uint)(fVar1 * (fVar29 / fVar11) * 1.0000002));
        auVar24 = vroundss_avx(auVar24,auVar24,9);
        auVar24 = vmaxss_avx(ZEXT816(0) << 0x40,auVar24);
        pBVar5 = (this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).
                 super_CurveGeometry.tangents.items;
        lVar20 = (long)(int)auVar24._0_4_ * 0x38 + 0x10;
        uVar19 = (long)(int)auVar24._0_4_ - 1;
LAB_00bc7132:
        uVar19 = uVar19 + 1;
        if ((ulong)(long)(int)auVar27._0_4_ < uVar19) {
          local_198.primID = &local_120;
          local_158 = auVar25._0_4_ - fVar22;
          fVar29 = fVar29 / local_158;
          local_158 = (fVar35 - fVar22) / local_158;
          fVar11 = fVar1 * fVar29;
          fVar22 = fVar1 * local_158;
          auVar27 = vroundss_avx(ZEXT416((uint)fVar11),ZEXT416((uint)fVar11),9);
          auVar31 = vroundss_avx(ZEXT416((uint)fVar22),ZEXT416((uint)fVar22),10);
          auVar25 = vmaxss_avx(auVar27,ZEXT816(0));
          local_148._0_4_ = auVar25._0_4_;
          auVar24 = vminss_avx(auVar31,ZEXT416((uint)fVar1));
          iVar16 = (int)auVar25._0_4_;
          fVar30 = auVar24._0_4_;
          local_168 = (float)(int)auVar27._0_4_;
          iVar21 = -1;
          if (-1 < (int)local_168) {
            iVar21 = (int)local_168;
          }
          iVar12 = (int)fVar1 + 1;
          if ((int)auVar31._0_4_ < (int)fVar1 + 1) {
            iVar12 = (int)auVar31._0_4_;
          }
          local_198.this = this;
          local_120 = uVar18;
          linearBounds::anon_class_16_2_07cfa4d6::operator()(&blower0,&local_198,(long)iVar16);
          linearBounds::anon_class_16_2_07cfa4d6::operator()(&bupper1,&local_198,(long)(int)fVar30);
          fVar11 = fVar11 - (float)local_148._0_4_;
          if (iVar12 - iVar21 == 1) {
            auVar25 = vmaxss_avx(ZEXT416((uint)fVar11),ZEXT816(0) << 0x40);
            auVar24 = vshufps_avx(auVar25,auVar25,0);
            auVar25 = ZEXT416((uint)(1.0 - auVar25._0_4_));
            auVar25 = vshufps_avx(auVar25,auVar25,0);
            auVar36._0_4_ =
                 auVar24._0_4_ * bupper1.lower.field_0.m128[0] +
                 auVar25._0_4_ * blower0.lower.field_0.m128[0];
            auVar36._4_4_ =
                 auVar24._4_4_ * bupper1.lower.field_0.m128[1] +
                 auVar25._4_4_ * blower0.lower.field_0.m128[1];
            auVar36._8_4_ =
                 auVar24._8_4_ * bupper1.lower.field_0.m128[2] +
                 auVar25._8_4_ * blower0.lower.field_0.m128[2];
            auVar36._12_4_ =
                 auVar24._12_4_ * bupper1.lower.field_0.m128[3] +
                 auVar25._12_4_ * blower0.lower.field_0.m128[3];
            auVar38._0_4_ =
                 auVar24._0_4_ * bupper1.upper.field_0.m128[0] +
                 auVar25._0_4_ * blower0.upper.field_0.m128[0];
            auVar38._4_4_ =
                 auVar24._4_4_ * bupper1.upper.field_0.m128[1] +
                 auVar25._4_4_ * blower0.upper.field_0.m128[1];
            auVar38._8_4_ =
                 auVar24._8_4_ * bupper1.upper.field_0.m128[2] +
                 auVar25._8_4_ * blower0.upper.field_0.m128[2];
            auVar38._12_4_ =
                 auVar24._12_4_ * bupper1.upper.field_0.m128[3] +
                 auVar25._12_4_ * blower0.upper.field_0.m128[3];
            auVar25 = vmaxss_avx(ZEXT416((uint)(fVar30 - fVar22)),ZEXT816(0) << 0x40);
            auVar24 = vshufps_avx(auVar25,auVar25,0);
            auVar25 = ZEXT416((uint)(1.0 - auVar25._0_4_));
            auVar25 = vshufps_avx(auVar25,auVar25,0);
            auVar27._0_4_ =
                 auVar25._0_4_ * bupper1.lower.field_0.m128[0] +
                 auVar24._0_4_ * blower0.lower.field_0.m128[0];
            auVar27._4_4_ =
                 auVar25._4_4_ * bupper1.lower.field_0.m128[1] +
                 auVar24._4_4_ * blower0.lower.field_0.m128[1];
            auVar27._8_4_ =
                 auVar25._8_4_ * bupper1.lower.field_0.m128[2] +
                 auVar24._8_4_ * blower0.lower.field_0.m128[2];
            auVar27._12_4_ =
                 auVar25._12_4_ * bupper1.lower.field_0.m128[3] +
                 auVar24._12_4_ * blower0.lower.field_0.m128[3];
            auVar31._0_4_ =
                 auVar25._0_4_ * bupper1.upper.field_0.m128[0] +
                 auVar24._0_4_ * blower0.upper.field_0.m128[0];
            auVar31._4_4_ =
                 auVar25._4_4_ * bupper1.upper.field_0.m128[1] +
                 auVar24._4_4_ * blower0.upper.field_0.m128[1];
            auVar31._8_4_ =
                 auVar25._8_4_ * bupper1.upper.field_0.m128[2] +
                 auVar24._8_4_ * blower0.upper.field_0.m128[2];
            auVar31._12_4_ =
                 auVar25._12_4_ * bupper1.upper.field_0.m128[3] +
                 auVar24._12_4_ * blower0.upper.field_0.m128[3];
          }
          else {
            linearBounds::anon_class_16_2_07cfa4d6::operator()
                      (&blower1,&local_198,(long)(iVar16 + 1));
            linearBounds::anon_class_16_2_07cfa4d6::operator()
                      (&bupper0,&local_198,(long)((int)fVar30 + -1));
            auVar25 = vmaxss_avx(ZEXT416((uint)fVar11),ZEXT816(0) << 0x40);
            auVar24 = vshufps_avx(auVar25,auVar25,0);
            auVar25 = ZEXT416((uint)(1.0 - auVar25._0_4_));
            auVar25 = vshufps_avx(auVar25,auVar25,0);
            auVar36._0_4_ =
                 auVar24._0_4_ * blower1.lower.field_0.m128[0] +
                 auVar25._0_4_ * blower0.lower.field_0.m128[0];
            auVar36._4_4_ =
                 auVar24._4_4_ * blower1.lower.field_0.m128[1] +
                 auVar25._4_4_ * blower0.lower.field_0.m128[1];
            auVar36._8_4_ =
                 auVar24._8_4_ * blower1.lower.field_0.m128[2] +
                 auVar25._8_4_ * blower0.lower.field_0.m128[2];
            auVar36._12_4_ =
                 auVar24._12_4_ * blower1.lower.field_0.m128[3] +
                 auVar25._12_4_ * blower0.lower.field_0.m128[3];
            auVar38._0_4_ =
                 auVar24._0_4_ * blower1.upper.field_0.m128[0] +
                 auVar25._0_4_ * blower0.upper.field_0.m128[0];
            auVar38._4_4_ =
                 auVar24._4_4_ * blower1.upper.field_0.m128[1] +
                 auVar25._4_4_ * blower0.upper.field_0.m128[1];
            auVar38._8_4_ =
                 auVar24._8_4_ * blower1.upper.field_0.m128[2] +
                 auVar25._8_4_ * blower0.upper.field_0.m128[2];
            auVar38._12_4_ =
                 auVar24._12_4_ * blower1.upper.field_0.m128[3] +
                 auVar25._12_4_ * blower0.upper.field_0.m128[3];
            auVar25 = vmaxss_avx(ZEXT416((uint)(fVar30 - fVar22)),ZEXT816(0) << 0x40);
            auVar24 = vshufps_avx(auVar25,auVar25,0);
            auVar25 = ZEXT416((uint)(1.0 - auVar25._0_4_));
            auVar25 = vshufps_avx(auVar25,auVar25,0);
            auVar27._0_4_ =
                 auVar24._0_4_ * bupper0.lower.field_0.m128[0] +
                 auVar25._0_4_ * bupper1.lower.field_0.m128[0];
            auVar27._4_4_ =
                 auVar24._4_4_ * bupper0.lower.field_0.m128[1] +
                 auVar25._4_4_ * bupper1.lower.field_0.m128[1];
            auVar27._8_4_ =
                 auVar24._8_4_ * bupper0.lower.field_0.m128[2] +
                 auVar25._8_4_ * bupper1.lower.field_0.m128[2];
            auVar27._12_4_ =
                 auVar24._12_4_ * bupper0.lower.field_0.m128[3] +
                 auVar25._12_4_ * bupper1.lower.field_0.m128[3];
            auVar31._0_4_ =
                 auVar24._0_4_ * bupper0.upper.field_0.m128[0] +
                 auVar25._0_4_ * bupper1.upper.field_0.m128[0];
            auVar31._4_4_ =
                 auVar24._4_4_ * bupper0.upper.field_0.m128[1] +
                 auVar25._4_4_ * bupper1.upper.field_0.m128[1];
            auVar31._8_4_ =
                 auVar24._8_4_ * bupper0.upper.field_0.m128[2] +
                 auVar25._8_4_ * bupper1.upper.field_0.m128[2];
            auVar31._12_4_ =
                 auVar24._12_4_ * bupper0.upper.field_0.m128[3] +
                 auVar25._12_4_ * bupper1.upper.field_0.m128[3];
            if ((int)local_168 < 0) {
              local_168 = -NAN;
            }
            fVar11 = local_158 - fVar29;
            itime = (size_t)(int)local_168;
            while (itime = itime + 1, (long)itime < (long)iVar12) {
              auVar26._0_4_ = ((float)(int)itime / fVar1 - fVar29) / fVar11;
              auVar26._4_12_ = SUB6012((undefined1  [60])0x0,0);
              auVar25 = vshufps_avx(auVar26,auVar26,0);
              local_1c8 = auVar27._0_4_;
              fStack_1c4 = auVar27._4_4_;
              fStack_1c0 = auVar27._8_4_;
              fStack_1bc = auVar27._12_4_;
              auVar24 = vshufps_avx(ZEXT416((uint)(1.0 - auVar26._0_4_)),
                                    ZEXT416((uint)(1.0 - auVar26._0_4_)),0);
              fVar22 = auVar36._4_4_;
              fVar30 = auVar36._8_4_;
              fVar40 = auVar36._12_4_;
              local_158 = auVar25._0_4_ * local_1c8 + auVar36._0_4_ * auVar24._0_4_;
              fStack_154 = auVar25._4_4_ * fStack_1c4 + fVar22 * auVar24._4_4_;
              fStack_150 = auVar25._8_4_ * fStack_1c0 + fVar30 * auVar24._8_4_;
              fStack_14c = auVar25._12_4_ * fStack_1bc + fVar40 * auVar24._12_4_;
              fVar41 = auVar38._4_4_;
              fVar42 = auVar38._8_4_;
              fVar43 = auVar38._12_4_;
              local_168 = auVar31._0_4_ * auVar25._0_4_ + auVar38._0_4_ * auVar24._0_4_;
              fStack_164 = auVar31._4_4_ * auVar25._4_4_ + fVar41 * auVar24._4_4_;
              fStack_160 = auVar31._8_4_ * auVar25._8_4_ + fVar42 * auVar24._8_4_;
              fStack_15c = auVar31._12_4_ * auVar25._12_4_ + fVar43 * auVar24._12_4_;
              _local_148 = auVar31;
              linearBounds::anon_class_16_2_07cfa4d6::operator()(&bi,&local_198,itime);
              auVar14._4_4_ = fStack_154;
              auVar14._0_4_ = local_158;
              auVar14._8_4_ = fStack_150;
              auVar14._12_4_ = fStack_14c;
              auVar25 = vsubps_avx((undefined1  [16])bi.lower.field_0,auVar14);
              auVar13._4_4_ = fStack_164;
              auVar13._0_4_ = local_168;
              auVar13._8_4_ = fStack_160;
              auVar13._12_4_ = fStack_15c;
              auVar27 = vsubps_avx((undefined1  [16])bi.upper.field_0,auVar13);
              auVar24 = vminps_avx(auVar25,ZEXT816(0) << 0x40);
              auVar25 = vmaxps_avx(auVar27,ZEXT816(0) << 0x40);
              auVar36._0_4_ = auVar36._0_4_ + auVar24._0_4_;
              auVar36._4_4_ = fVar22 + auVar24._4_4_;
              auVar36._8_4_ = fVar30 + auVar24._8_4_;
              auVar36._12_4_ = fVar40 + auVar24._12_4_;
              auVar27._0_4_ = local_1c8 + auVar24._0_4_;
              auVar27._4_4_ = fStack_1c4 + auVar24._4_4_;
              auVar27._8_4_ = fStack_1c0 + auVar24._8_4_;
              auVar27._12_4_ = fStack_1bc + auVar24._12_4_;
              auVar38._0_4_ = auVar38._0_4_ + auVar25._0_4_;
              auVar38._4_4_ = fVar41 + auVar25._4_4_;
              auVar38._8_4_ = fVar42 + auVar25._8_4_;
              auVar38._12_4_ = fVar43 + auVar25._12_4_;
              auVar31._0_4_ = (float)local_148._0_4_ + auVar25._0_4_;
              auVar31._4_4_ = (float)local_148._4_4_ + auVar25._4_4_;
              auVar31._8_4_ = fStack_140 + auVar25._8_4_;
              auVar31._12_4_ = fStack_13c + auVar25._12_4_;
            }
          }
          auVar25 = vcmpps_avx(auVar36,auVar38,2);
          uVar15 = vmovmskps_avx(auVar25);
          auVar33 = ZEXT1664(auVar32);
          auVar34 = ZEXT1664(auVar23);
          auVar37 = ZEXT1664(CONCAT412(0xddccb9a2,CONCAT48(0xddccb9a2,0xddccb9a2ddccb9a2)));
          auVar39 = ZEXT1664(CONCAT412(0x5dccb9a2,CONCAT48(0x5dccb9a2,0x5dccb9a25dccb9a2)));
          r = local_128;
          if ((~(byte)uVar15 & 7) == 0) {
            auVar25 = vcmpps_avx(auVar27,auVar31,2);
            uVar15 = vmovmskps_avx(auVar25);
            if ((~(byte)uVar15 & 7) == 0) {
              auVar25 = vminps_avx(auVar36,auVar27);
              aVar9 = (anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1)
                      vinsertps_avx(auVar25,ZEXT416(geomID),0x30);
              auVar25 = vmaxps_avx(auVar38,auVar31);
              aVar10 = (anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1)
                       vinsertps_avx(auVar25,ZEXT416((uint)uVar18),0x30);
              auVar28._0_4_ = aVar9.x + aVar10.x;
              auVar28._4_4_ = aVar9.y + aVar10.y;
              auVar28._8_4_ = aVar9.z + aVar10.z;
              auVar28._12_4_ = aVar9.field_3.w + aVar10.field_3.w;
              local_188 = vminps_avx(local_188,(undefined1  [16])aVar9);
              local_178 = vmaxps_avx(local_178,(undefined1  [16])aVar10);
              auVar32 = vminps_avx(auVar32,auVar28);
              auVar33 = ZEXT1664(auVar32);
              auVar32 = vmaxps_avx(auVar23,auVar28);
              auVar34 = ZEXT1664(auVar32);
              local_1b0 = local_1b0 + 1;
              local_138[local_1b8].lower.field_0.field_1 = aVar9;
              local_138[local_1b8].upper.field_0.field_1 = aVar10;
              local_1b8 = local_1b8 + 1;
            }
          }
        }
        else {
          lVar6 = *(long *)((long)pBVar4 + lVar20 + -0x10);
          lVar7 = *(long *)((long)&(pBVar4->super_RawBufferView).ptr_ofs + lVar20);
          auVar24 = *(undefined1 (*) [16])(lVar6 + lVar7 * (ulong)uVar3);
          auVar36 = auVar37._0_16_;
          auVar31 = vcmpps_avx(auVar24,auVar36,2);
          auVar38 = auVar39._0_16_;
          auVar24 = vcmpps_avx(auVar24,auVar38,5);
          auVar24 = vorps_avx(auVar31,auVar24);
          if ((((auVar24 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
               (auVar24 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              (auVar24 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              -1 < auVar24[0xf]) {
            auVar24 = *(undefined1 (*) [16])(lVar6 + lVar7 * uVar17);
            auVar31 = vcmpps_avx(auVar24,auVar36,2);
            auVar24 = vcmpps_avx(auVar24,auVar38,5);
            auVar24 = vorps_avx(auVar31,auVar24);
            if ((((auVar24 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                 (auVar24 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                (auVar24 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                -1 < auVar24[0xf]) {
              lVar6 = *(long *)((long)pBVar5 + lVar20 + -0x10);
              lVar7 = *(long *)((long)&(pBVar5->super_RawBufferView).ptr_ofs + lVar20);
              auVar24 = *(undefined1 (*) [16])(lVar6 + lVar7 * (ulong)uVar3);
              auVar31 = vcmpps_avx(auVar24,auVar36,2);
              auVar24 = vcmpps_avx(auVar24,auVar38,5);
              auVar24 = vorps_avx(auVar31,auVar24);
              if ((((auVar24 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                   (auVar24 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (auVar24 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  -1 < auVar24[0xf]) goto code_r0x00bc71c5;
            }
          }
        }
      }
LAB_00bc747d:
      uVar18 = uVar18 + 1;
    }
    *(undefined8 *)
     &(local_130->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0 =
         local_188._0_8_;
    *(undefined8 *)
     ((long)&(local_130->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0 + 8
     ) = local_188._8_8_;
    *(undefined8 *)
     &(local_130->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.field_0 =
         local_178._0_8_;
    *(undefined8 *)
     ((long)&(local_130->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.field_0 + 8
     ) = local_178._8_8_;
    *(undefined1 (*) [16])
     (local_130->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.field_0.m128 =
         auVar32;
    *(undefined1 (*) [16])
     (local_130->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.field_0.m128 =
         auVar23;
    local_130->end = local_1b0;
    __return_storage_ptr__ = local_130;
  }
  return __return_storage_ptr__;
code_r0x00bc71c5:
  lVar20 = lVar20 + 0x38;
  auVar24 = *(undefined1 (*) [16])(lVar6 + lVar7 * uVar17);
  auVar31 = vcmpps_avx(auVar24,auVar36,2);
  auVar24 = vcmpps_avx(auVar24,auVar38,5);
  auVar24 = vorps_avx(auVar31,auVar24);
  if ((((auVar24 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
       (auVar24 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
      (auVar24 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar24[0xf] < '\0')
  goto LAB_00bc747d;
  goto LAB_00bc7132;
}

Assistant:

PrimInfo createPrimRefArrayMB(PrimRef* prims, const BBox1f& time_range, const range<size_t>& r, size_t k, unsigned int geomID) const
      {
        PrimInfo pinfo(empty);
        const BBox1f t0t1 = BBox1f::intersect(this->time_range, time_range);
        if (t0t1.empty()) return pinfo;
        
        for (size_t j=r.begin(); j<r.end(); j++)
        {
          if (!valid(ctype, j, this->timeSegmentRange(t0t1))) continue;
          const LBBox3fa lbounds = linearBounds(j,t0t1);
          if (lbounds.bounds0.empty() || lbounds.bounds1.empty()) continue; // checks oriented curves with invalid normals which cause NaNs here
          const PrimRef prim(lbounds.bounds(),geomID,unsigned(j));
          pinfo.add_primref(prim);
          prims[k++] = prim;
        }
        return pinfo;
      }